

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::BoundsAreResetOnRequest(VectorRasterizerTests *this)

{
  int x1;
  int y1;
  int x2;
  int y2;
  allocator local_141;
  string local_140 [32];
  LocationInfo local_120;
  int local_f4 [2];
  allocator local_e9;
  string local_e8 [32];
  LocationInfo local_c8;
  int local_9c [5];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  x1 = anon_unknown_5::fp(13.0);
  y1 = anon_unknown_5::fp(17.0);
  x2 = anon_unknown_5::fp(13.5);
  y2 = anon_unknown_5::fp(17.7);
  vector_rasterizer::line((vector_rasterizer *)local_88,x1,y1,x2,y2);
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  local_9c[1] = 0;
  local_9c[0] = vector_rasterizer::width((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_c8,(string *)local_e8,0x6d);
  ut::are_equal<int,int>(local_9c + 1,local_9c,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_f4[1] = 0;
  local_f4[0] = vector_rasterizer::height((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x6e);
  ut::are_equal<int,int>(local_f4 + 1,local_f4,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( BoundsAreResetOnRequest )
			{
				// INIT
				vector_rasterizer vr;

				vr.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));

				// ACT
				vr.reset();

				// ACT / ASSERT
				assert_equal(0, vr.width());
				assert_equal(0, vr.height());
			}